

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int io_open(lua_State *L)

{
  int iVar1;
  char *__filename;
  char *__modes;
  FILE **ppFVar2;
  FILE *pFVar3;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  ppFVar2 = newfile(L);
  pFVar3 = fopen(__filename,__modes);
  *ppFVar2 = (FILE *)pFVar3;
  if (pFVar3 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = pushresult(L,0,__filename);
  return iVar1;
}

Assistant:

static int io_open (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  FILE **pf = newfile(L);
  *pf = fopen(filename, mode);
  return (*pf == NULL) ? pushresult(L, 0, filename) : 1;
}